

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O2

void __thiscall Omega_invoke_Test::Omega_invoke_Test(Omega_invoke_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00152028;
  return;
}

Assistant:

TEST(Omega, invoke)
{
    std::ostringstream result;
    auto function = [&result](int a, int b, std::string const &n)
    {
        result << "a=" << a << ", b=" << b << ", n=" << n;
    };

    auto const t1 = omega::make_list<1, 3>(t);

    omega::invoke(function, t1);
    EXPECT_EQ(result.str(), "a=6, b=7, n=yuppi!");

}